

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O3

int test_list(void)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  bool bVar10;
  uint uVar11;
  int n_data;
  int test_ret_1;
  bool bVar12;
  int test_ret_17;
  int test_ret;
  int test_ret_2;
  int test_ret_4;
  int test_ret_5;
  int test_ret_3;
  int test_ret_6;
  int local_48;
  uint local_44;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  
  if (quiet == '\0') {
    puts("Testing list : 19 of 26 functions ...");
  }
  iVar2 = xmlMemBlocks();
  xmlLinkGetData(0);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar3 = xmlMemBlocks();
  if (iVar2 != iVar3) {
    iVar4 = xmlMemBlocks();
    printf("Leak of %d blocks found in xmlLinkGetData",(ulong)(uint)(iVar4 - iVar2));
    printf(" %d",0);
    putchar(10);
  }
  function_tests = function_tests + 1;
  local_48 = 0;
  uVar11 = 0;
  bVar1 = true;
  do {
    bVar12 = bVar1;
    iVar4 = 0;
    do {
      iVar5 = xmlMemBlocks();
      if (bVar12) {
        lVar8 = xmlListCreate(0,0);
      }
      else {
        lVar8 = 0;
      }
      xmlListAppend();
      call_tests = call_tests + 1;
      if (lVar8 != 0) {
        xmlListDelete();
      }
      xmlResetLastError();
      iVar6 = xmlMemBlocks();
      if (iVar5 != iVar6) {
        iVar6 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlListAppend",(ulong)(uint)(iVar6 - iVar5));
        local_48 = local_48 + 1;
        printf(" %d",(ulong)uVar11);
        printf(" %d");
        putchar(10);
      }
      iVar4 = iVar4 + 1;
    } while (iVar4 != 3);
    uVar11 = 1;
    bVar1 = false;
  } while (bVar12);
  function_tests = function_tests + 1;
  iVar4 = 0;
  bVar1 = true;
  do {
    bVar12 = bVar1;
    iVar5 = xmlMemBlocks();
    if (bVar12) {
      lVar8 = xmlListCreate(0,0);
    }
    else {
      lVar8 = 0;
    }
    xmlListClear();
    call_tests = call_tests + 1;
    if (lVar8 != 0) {
      xmlListDelete();
    }
    xmlResetLastError();
    iVar6 = xmlMemBlocks();
    if (iVar5 != iVar6) {
      iVar6 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlListClear",(ulong)(uint)(iVar6 - iVar5));
      iVar4 = iVar4 + 1;
      printf(" %d");
      putchar(10);
    }
    bVar1 = false;
  } while (bVar12);
  function_tests = function_tests + 1;
  local_44 = 0;
  bVar1 = true;
  do {
    bVar12 = bVar1;
    iVar5 = xmlMemBlocks();
    if (bVar12) {
      lVar8 = xmlListCreate(0,0);
    }
    else {
      lVar8 = 0;
    }
    xmlListCopy();
    call_tests = call_tests + 1;
    if (lVar8 != 0) {
      xmlListDelete();
    }
    xmlResetLastError();
    iVar6 = xmlMemBlocks();
    if (iVar5 != iVar6) {
      iVar6 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlListCopy",(ulong)(uint)(iVar6 - iVar5));
      local_44 = local_44 + 1;
      printf(" %d");
      printf(" %d");
      putchar(10);
    }
    bVar1 = false;
  } while (bVar12);
  function_tests = function_tests + 1;
  local_38 = 0;
  bVar1 = true;
  do {
    bVar12 = bVar1;
    iVar5 = xmlMemBlocks();
    if (bVar12) {
      lVar8 = xmlListCreate(0,0);
    }
    else {
      lVar8 = 0;
    }
    xmlListEmpty();
    call_tests = call_tests + 1;
    if (lVar8 != 0) {
      xmlListDelete();
    }
    xmlResetLastError();
    iVar6 = xmlMemBlocks();
    if (iVar5 != iVar6) {
      iVar6 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlListEmpty",(ulong)(uint)(iVar6 - iVar5));
      local_38 = local_38 + 1;
      printf(" %d");
      putchar(10);
    }
    bVar1 = false;
  } while (bVar12);
  function_tests = function_tests + 1;
  local_40 = 0;
  uVar11 = 0;
  bVar1 = true;
  do {
    bVar12 = bVar1;
    iVar5 = 0;
    do {
      iVar6 = xmlMemBlocks();
      if (bVar12) {
        lVar8 = xmlListCreate(0,0);
      }
      else {
        lVar8 = 0;
      }
      xmlListInsert();
      call_tests = call_tests + 1;
      if (lVar8 != 0) {
        xmlListDelete();
      }
      xmlResetLastError();
      iVar7 = xmlMemBlocks();
      if (iVar6 != iVar7) {
        iVar7 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlListInsert",(ulong)(uint)(iVar7 - iVar6));
        local_40 = local_40 + 1;
        printf(" %d",(ulong)uVar11);
        printf(" %d");
        putchar(10);
      }
      iVar5 = iVar5 + 1;
    } while (iVar5 != 3);
    uVar11 = 1;
    bVar1 = false;
  } while (bVar12);
  iVar2 = local_48 + (uint)(iVar2 != iVar3) + iVar4 + local_44;
  function_tests = function_tests + 1;
  local_3c = 0;
  local_44 = 0;
  bVar1 = true;
  do {
    bVar12 = bVar1;
    bVar1 = true;
    do {
      bVar10 = bVar1;
      iVar3 = xmlMemBlocks();
      if (bVar12) {
        lVar8 = xmlListCreate(0,0);
      }
      else {
        lVar8 = 0;
      }
      if (bVar10) {
        lVar9 = xmlListCreate(0,0);
      }
      else {
        lVar9 = 0;
      }
      xmlListMerge();
      call_tests = call_tests + 1;
      if (lVar8 != 0) {
        xmlListDelete();
      }
      if (lVar9 != 0) {
        xmlListDelete();
      }
      xmlResetLastError();
      iVar4 = xmlMemBlocks();
      if (iVar3 != iVar4) {
        iVar4 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlListMerge",(ulong)(uint)(iVar4 - iVar3));
        local_3c = local_3c + 1;
        printf(" %d",(ulong)local_44);
        printf(" %d");
        putchar(10);
      }
      bVar1 = false;
    } while (bVar10);
    local_44 = 1;
    bVar1 = false;
  } while (bVar12);
  iVar2 = iVar2 + local_38;
  function_tests = function_tests + 1;
  local_34 = 0;
  bVar1 = true;
  do {
    bVar12 = bVar1;
    iVar3 = xmlMemBlocks();
    if (bVar12) {
      lVar8 = xmlListCreate(0,0);
    }
    else {
      lVar8 = 0;
    }
    xmlListPopBack();
    call_tests = call_tests + 1;
    if (lVar8 != 0) {
      xmlListDelete();
    }
    xmlResetLastError();
    iVar4 = xmlMemBlocks();
    if (iVar3 != iVar4) {
      iVar4 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlListPopBack",(ulong)(uint)(iVar4 - iVar3));
      local_34 = local_34 + 1;
      printf(" %d");
      putchar(10);
    }
    bVar1 = false;
  } while (bVar12);
  function_tests = function_tests + 1;
  local_38 = 0;
  bVar1 = true;
  do {
    bVar12 = bVar1;
    iVar3 = xmlMemBlocks();
    if (bVar12) {
      lVar8 = xmlListCreate(0,0);
    }
    else {
      lVar8 = 0;
    }
    xmlListPopFront();
    call_tests = call_tests + 1;
    if (lVar8 != 0) {
      xmlListDelete();
    }
    xmlResetLastError();
    iVar4 = xmlMemBlocks();
    if (iVar3 != iVar4) {
      iVar4 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlListPopFront",(ulong)(uint)(iVar4 - iVar3));
      local_38 = local_38 + 1;
      printf(" %d");
      putchar(10);
    }
    bVar1 = false;
  } while (bVar12);
  function_tests = function_tests + 1;
  iVar2 = iVar2 + local_40 + local_3c;
  local_44 = 0;
  uVar11 = 0;
  bVar1 = true;
  do {
    bVar12 = bVar1;
    iVar3 = 0;
    do {
      iVar4 = xmlMemBlocks();
      if (bVar12) {
        lVar8 = xmlListCreate(0,0);
      }
      else {
        lVar8 = 0;
      }
      xmlListPushBack();
      call_tests = call_tests + 1;
      if (lVar8 != 0) {
        xmlListDelete();
      }
      xmlResetLastError();
      iVar5 = xmlMemBlocks();
      if (iVar4 != iVar5) {
        iVar5 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlListPushBack",(ulong)(uint)(iVar5 - iVar4));
        local_44 = local_44 + 1;
        printf(" %d",(ulong)uVar11);
        printf(" %d");
        putchar(10);
      }
      iVar3 = iVar3 + 1;
    } while (iVar3 != 3);
    uVar11 = 1;
    bVar1 = false;
  } while (bVar12);
  function_tests = function_tests + 1;
  local_40 = 0;
  uVar11 = 0;
  bVar1 = true;
  do {
    bVar12 = bVar1;
    iVar3 = 0;
    do {
      iVar4 = xmlMemBlocks();
      if (bVar12) {
        lVar8 = xmlListCreate(0,0);
      }
      else {
        lVar8 = 0;
      }
      xmlListPushFront();
      call_tests = call_tests + 1;
      if (lVar8 != 0) {
        xmlListDelete();
      }
      xmlResetLastError();
      iVar5 = xmlMemBlocks();
      if (iVar4 != iVar5) {
        iVar5 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlListPushFront",(ulong)(uint)(iVar5 - iVar4));
        local_40 = local_40 + 1;
        printf(" %d",(ulong)uVar11);
        printf(" %d");
        putchar(10);
      }
      iVar3 = iVar3 + 1;
    } while (iVar3 != 3);
    uVar11 = 1;
    bVar1 = false;
  } while (bVar12);
  function_tests = function_tests + 1;
  local_3c = 0;
  uVar11 = 0;
  bVar1 = true;
  do {
    bVar12 = bVar1;
    iVar3 = 0;
    do {
      iVar4 = xmlMemBlocks();
      if (bVar12) {
        lVar8 = xmlListCreate(0,0);
      }
      else {
        lVar8 = 0;
      }
      xmlListRemoveAll();
      call_tests = call_tests + 1;
      if (lVar8 != 0) {
        xmlListDelete();
      }
      xmlResetLastError();
      iVar5 = xmlMemBlocks();
      if (iVar4 != iVar5) {
        iVar5 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlListRemoveAll",(ulong)(uint)(iVar5 - iVar4));
        local_3c = local_3c + 1;
        printf(" %d",(ulong)uVar11);
        printf(" %d");
        putchar(10);
      }
      iVar3 = iVar3 + 1;
    } while (iVar3 != 3);
    uVar11 = 1;
    bVar1 = false;
  } while (bVar12);
  function_tests = function_tests + 1;
  iVar2 = iVar2 + local_34 + local_38 + local_44;
  local_44 = 0;
  uVar11 = 0;
  bVar1 = true;
  do {
    bVar12 = bVar1;
    iVar3 = 0;
    do {
      iVar4 = xmlMemBlocks();
      if (bVar12) {
        lVar8 = xmlListCreate(0,0);
      }
      else {
        lVar8 = 0;
      }
      xmlListRemoveFirst();
      call_tests = call_tests + 1;
      if (lVar8 != 0) {
        xmlListDelete();
      }
      xmlResetLastError();
      iVar5 = xmlMemBlocks();
      if (iVar4 != iVar5) {
        iVar5 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlListRemoveFirst",(ulong)(uint)(iVar5 - iVar4));
        local_44 = local_44 + 1;
        printf(" %d",(ulong)uVar11);
        printf(" %d");
        putchar(10);
      }
      iVar3 = iVar3 + 1;
    } while (iVar3 != 3);
    uVar11 = 1;
    bVar1 = false;
  } while (bVar12);
  function_tests = function_tests + 1;
  iVar2 = iVar2 + local_40;
  local_40 = 0;
  uVar11 = 0;
  bVar1 = true;
  do {
    bVar12 = bVar1;
    iVar3 = 0;
    do {
      iVar4 = xmlMemBlocks();
      if (bVar12) {
        lVar8 = xmlListCreate(0,0);
      }
      else {
        lVar8 = 0;
      }
      xmlListRemoveLast();
      call_tests = call_tests + 1;
      if (lVar8 != 0) {
        xmlListDelete();
      }
      xmlResetLastError();
      iVar5 = xmlMemBlocks();
      if (iVar4 != iVar5) {
        iVar5 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlListRemoveLast",(ulong)(uint)(iVar5 - iVar4));
        local_40 = local_40 + 1;
        printf(" %d",(ulong)uVar11);
        printf(" %d");
        putchar(10);
      }
      iVar3 = iVar3 + 1;
    } while (iVar3 != 3);
    uVar11 = 1;
    bVar1 = false;
  } while (bVar12);
  iVar2 = iVar2 + local_3c;
  function_tests = function_tests + 1;
  local_3c = 0;
  bVar1 = true;
  do {
    bVar12 = bVar1;
    iVar3 = xmlMemBlocks();
    if (bVar12) {
      lVar8 = xmlListCreate(0,0);
    }
    else {
      lVar8 = 0;
    }
    xmlListReverse();
    call_tests = call_tests + 1;
    if (lVar8 != 0) {
      xmlListDelete();
    }
    xmlResetLastError();
    iVar4 = xmlMemBlocks();
    if (iVar3 != iVar4) {
      iVar4 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlListReverse",(ulong)(uint)(iVar4 - iVar3));
      local_3c = local_3c + 1;
      printf(" %d");
      putchar(10);
    }
    bVar1 = false;
  } while (bVar12);
  function_tests = function_tests + 1;
  iVar2 = iVar2 + local_44;
  local_44 = 0;
  uVar11 = 0;
  bVar1 = true;
  do {
    bVar12 = bVar1;
    iVar3 = 0;
    do {
      iVar4 = xmlMemBlocks();
      if (bVar12) {
        lVar8 = xmlListCreate(0,0);
      }
      else {
        lVar8 = 0;
      }
      xmlListReverseSearch();
      call_tests = call_tests + 1;
      if (lVar8 != 0) {
        xmlListDelete();
      }
      xmlResetLastError();
      iVar5 = xmlMemBlocks();
      if (iVar4 != iVar5) {
        iVar5 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlListReverseSearch",(ulong)(uint)(iVar5 - iVar4));
        local_44 = local_44 + 1;
        printf(" %d",(ulong)uVar11);
        printf(" %d");
        putchar(10);
      }
      iVar3 = iVar3 + 1;
    } while (iVar3 != 3);
    uVar11 = 1;
    bVar1 = false;
  } while (bVar12);
  function_tests = function_tests + 1;
  iVar2 = iVar2 + local_40;
  local_40 = 0;
  uVar11 = 0;
  bVar1 = true;
  do {
    bVar12 = bVar1;
    iVar3 = 0;
    do {
      iVar4 = xmlMemBlocks();
      if (bVar12) {
        lVar8 = xmlListCreate(0,0);
      }
      else {
        lVar8 = 0;
      }
      xmlListSearch();
      call_tests = call_tests + 1;
      if (lVar8 != 0) {
        xmlListDelete();
      }
      xmlResetLastError();
      iVar5 = xmlMemBlocks();
      if (iVar4 != iVar5) {
        iVar5 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlListSearch",(ulong)(uint)(iVar5 - iVar4));
        local_40 = local_40 + 1;
        printf(" %d",(ulong)uVar11);
        printf(" %d");
        putchar(10);
      }
      iVar3 = iVar3 + 1;
    } while (iVar3 != 3);
    uVar11 = 1;
    bVar1 = false;
  } while (bVar12);
  function_tests = function_tests + 1;
  iVar3 = 0;
  bVar1 = true;
  do {
    bVar12 = bVar1;
    iVar4 = xmlMemBlocks();
    if (bVar12) {
      lVar8 = xmlListCreate(0,0);
    }
    else {
      lVar8 = 0;
    }
    xmlListSize();
    call_tests = call_tests + 1;
    if (lVar8 != 0) {
      xmlListDelete();
    }
    xmlResetLastError();
    iVar5 = xmlMemBlocks();
    if (iVar4 != iVar5) {
      iVar5 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlListSize",(ulong)(uint)(iVar5 - iVar4));
      iVar3 = iVar3 + 1;
      printf(" %d");
      putchar(10);
    }
    bVar1 = false;
  } while (bVar12);
  function_tests = function_tests + 1;
  iVar4 = 0;
  bVar1 = true;
  do {
    bVar12 = bVar1;
    iVar5 = xmlMemBlocks();
    if (bVar12) {
      lVar8 = xmlListCreate(0,0);
    }
    else {
      lVar8 = 0;
    }
    xmlListSort();
    call_tests = call_tests + 1;
    if (lVar8 != 0) {
      xmlListDelete();
    }
    xmlResetLastError();
    iVar6 = xmlMemBlocks();
    if (iVar5 != iVar6) {
      iVar6 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlListSort",(ulong)(uint)(iVar6 - iVar5));
      iVar4 = iVar4 + 1;
      printf(" %d");
      putchar(10);
    }
    bVar1 = false;
  } while (bVar12);
  function_tests = function_tests + 1;
  uVar11 = iVar2 + local_3c + local_44 + local_40 + iVar3 + iVar4;
  if (uVar11 != 0) {
    printf("Module list: %d errors\n",(ulong)uVar11);
  }
  return uVar11;
}

Assistant:

static int
test_list(void) {
    int test_ret = 0;

    if (quiet == 0) printf("Testing list : 19 of 26 functions ...\n");
    test_ret += test_xmlLinkGetData();
    test_ret += test_xmlListAppend();
    test_ret += test_xmlListClear();
    test_ret += test_xmlListCopy();
    test_ret += test_xmlListCreate();
    test_ret += test_xmlListDup();
    test_ret += test_xmlListEmpty();
    test_ret += test_xmlListEnd();
    test_ret += test_xmlListFront();
    test_ret += test_xmlListInsert();
    test_ret += test_xmlListMerge();
    test_ret += test_xmlListPopBack();
    test_ret += test_xmlListPopFront();
    test_ret += test_xmlListPushBack();
    test_ret += test_xmlListPushFront();
    test_ret += test_xmlListRemoveAll();
    test_ret += test_xmlListRemoveFirst();
    test_ret += test_xmlListRemoveLast();
    test_ret += test_xmlListReverse();
    test_ret += test_xmlListReverseSearch();
    test_ret += test_xmlListReverseWalk();
    test_ret += test_xmlListSearch();
    test_ret += test_xmlListSize();
    test_ret += test_xmlListSort();
    test_ret += test_xmlListWalk();

    if (test_ret != 0)
	printf("Module list: %d errors\n", test_ret);
    return(test_ret);
}